

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockAddr.cpp
# Opt level: O2

void AGSSock::SockAddr_set_Port(SockAddr *sa,ags_t port)

{
  if (((sa->super_sockaddr_storage).ss_family | 8) == 10) {
    *(ushort *)(sa->super_sockaddr_storage).__ss_padding = (ushort)port << 8 | (ushort)port >> 8;
  }
  return;
}

Assistant:

void SockAddr_set_Port(SockAddr *sa, ags_t port)
{
	if (sa->ss_family == AF_INET)
	{
		sockaddr_in *addr = reinterpret_cast<sockaddr_in *> (sa);
		addr->sin_port = htons(port);
	}
	else if (sa->ss_family == AF_INET6)
	{
		sockaddr_in6 *addr = reinterpret_cast<sockaddr_in6 *> (sa);
		addr->sin6_port = htons(port);
	}
}